

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution::forward
          (Deconvolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int kernel_w;
  int kernel_h;
  uint _c;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Mat *bottom_blob;
  Mat *top_blob;
  int *piVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  Allocator **ppAVar13;
  undefined4 uVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  Option *in_stack_fffffffffffffe58;
  Mat local_168;
  undefined1 local_118 [32];
  Allocator *local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  int local_e0;
  size_t local_d8;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  top_blob = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar1 = bottom_blob->c;
  kernel_w = bottom_blob[1].w;
  kernel_h = bottom_blob[1].h;
  _c = bottom_blob[1].d;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar18 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00286b3f;
  local_c8.cstep = 0;
  uVar24 = kernel_h * kernel_w;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,uVar1 * _c * uVar24,4,opt->workspace_allocator);
  iVar18 = -100;
  if (local_c8.data != (void *)0x0) {
    pvVar16 = (void *)((long)local_c8.c * local_c8.cstep);
    if (pvVar16 != (void *)0x0) {
      if (0 < (int)_c) {
        uVar17 = (ulong)uVar24;
        uVar20 = 0;
        pvVar12 = local_c8.data;
        pvVar16 = local_78.data;
        do {
          if (0 < (int)uVar1) {
            uVar19 = 0;
            pvVar21 = pvVar16;
            pvVar22 = pvVar12;
            do {
              if (0 < (int)uVar24) {
                uVar23 = 0;
                do {
                  *(undefined4 *)((long)pvVar22 + uVar23 * 4) =
                       *(undefined4 *)((long)pvVar21 + uVar23 * 4);
                  uVar23 = uVar23 + 1;
                } while (uVar17 != uVar23);
              }
              uVar19 = uVar19 + 1;
              pvVar22 = (void *)((long)pvVar22 + uVar17 * 4);
              pvVar21 = (void *)((long)pvVar21 + _c * uVar17 * 4);
            } while (uVar19 != uVar1);
          }
          uVar20 = uVar20 + 1;
          pvVar12 = (void *)((long)pvVar12 + uVar1 * uVar17 * 4);
          pvVar16 = (void *)((long)pvVar16 + uVar17 * 4);
        } while (uVar20 != _c);
      }
      uVar14 = SUB84(pvVar16,0);
      local_d8 = 0;
      local_118._0_8_ = (void *)0x0;
      local_118._8_4_ = 0;
      local_118._12_4_ = 0;
      local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_f8 = (Allocator *)0x0;
      iStack_f0 = 0;
      iStack_ec = 0;
      uStack_e8._0_4_ = 0;
      uStack_e8._4_4_ = 0;
      local_e0 = 0;
      if (this->bias_term == 0) {
LAB_00286837:
        iVar18 = this->dilation_w;
        iVar2 = bottom_blob->w;
        iVar3 = this->stride_w;
        iVar4 = this->dilation_h;
        iVar5 = bottom_blob->h;
        iVar6 = this->stride_h;
        ppAVar13 = &opt->workspace_allocator;
        iVar7 = this->output_pad_right;
        iVar8 = this->output_pad_bottom;
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize = 0;
        local_168.elempack = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        auVar25._0_4_ = -(uint)(0 < this->pad_left);
        auVar25._4_4_ = -(uint)(0 < this->pad_right);
        auVar25._8_4_ = -(uint)(0 < this->pad_top);
        auVar25._12_4_ = -(uint)(0 < this->pad_bottom);
        iVar15 = movmskps(uVar14,auVar25);
        if ((iVar15 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
          if (&local_168 != top_blob) {
            piVar9 = top_blob->refcount;
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + 1;
              UNLOCK();
            }
            local_168.data = top_blob->data;
            local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
            local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
            local_168.elemsize = top_blob->elemsize;
            local_168.elempack = top_blob->elempack;
            local_168.allocator = top_blob->allocator;
            uVar10 = top_blob->dims;
            uVar11 = top_blob->w;
            local_168.h = top_blob->h;
            local_168.d = top_blob->d;
            local_168.c = top_blob->c;
            local_168.cstep = top_blob->cstep;
            local_168.dims = uVar10;
            local_168.w = uVar11;
          }
          ppAVar13 = &opt->blob_allocator;
        }
        Mat::create(&local_168,iVar7 + (kernel_w + -1) * iVar18 + (iVar2 + -1) * iVar3 + 1,
                    iVar8 + 1 + (kernel_h + -1) * iVar4 + (iVar5 + -1) * iVar6,_c,4,*ppAVar13);
        iVar18 = -100;
        if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
          deconvolution(bottom_blob,&local_168,&local_c8,(Mat *)local_118,kernel_w,kernel_h,
                        this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                        this->activation_type,&this->activation_params,in_stack_fffffffffffffe58);
          cut_padding(this,&local_168,top_blob,opt);
          if ((top_blob->data == (void *)0x0) ||
             (iVar18 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
            iVar18 = -100;
          }
        }
        piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              if (local_168.data != (void *)0x0) {
                free(local_168.data);
              }
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + 2,(Mat *)local_118,opt);
        iVar18 = -100;
        if (((void *)local_118._0_8_ != (void *)0x0) && ((long)local_e0 * local_d8 != 0))
        goto LAB_00286837;
      }
      piVar9 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_f8 == (Allocator *)0x0) {
            if ((void *)local_118._0_8_ != (void *)0x0) {
              free((void *)local_118._0_8_);
            }
          }
          else {
            (*local_f8->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  piVar9 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00286b3f:
  piVar9 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Deconvolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}